

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderProgramInterfaces.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderProgramInterfaces::verifyPropertyValue
          (TessellationShaderProgramInterfaces *this,GLenum interface,GLenum property,GLuint index,
          GLint expected_value)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  TestError *this_00;
  GLint property_value;
  GLenum property_local;
  
  property_local = property;
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  property_value = 0;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x9c8))
            (this->m_po_id,interface,index,1,&property_local,1,0,&property_value);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glGetProgramResourceiv() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                  ,0x23f);
  if (property_value == expected_value) {
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid GL_REFERENCED_BY_... property value reported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
             ,0x243);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderProgramInterfaces::verifyPropertyValue(glw::GLenum interface, glw::GLenum property,
															  glw::GLuint index, glw::GLint expected_value)
{
	const glw::Functions& gl			 = m_context.getRenderContext().getFunctions();
	glw::GLint			  property_value = 0;

	gl.getProgramResourceiv(m_po_id, interface, index, 1, /* propCount */
							&property, 1,				  /* bufSize */
							NULL,						  /* length */
							&property_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramResourceiv() failed");

	if (property_value != expected_value)
	{
		TCU_FAIL("Invalid GL_REFERENCED_BY_... property value reported");
	}
}